

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O0

exr_result_t
DwaCompressor_uncompress
          (DwaCompressor *me,uint8_t *inPtr,uint64_t iSize,void *uncompressed_data,
          uint64_t uncompressed_size)

{
  exr_coding_channel_info_t *peVar1;
  ChannelData *pCVar2;
  uint8_t *puVar3;
  exr_result_t eVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t uVar13;
  CscChannelSet *pCVar14;
  uint8_t *src0;
  size_t __n;
  void *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  DwaCompressor *in_RDI;
  size_t in_R8;
  int y_2;
  size_t dstScanlineSize;
  int row_1;
  int byte;
  int x;
  uint8_t *dst;
  int y_1;
  int row;
  LossyDctDecoder decoder_1;
  uint16_t *linearLut;
  int pixelSize;
  DctCoderChannelData *dcddata;
  exr_coding_channel_info_t *chan_1;
  ChannelData *cd_1;
  int c_2;
  int bChan;
  int gChan;
  int rChan;
  CscChannelSet *cset;
  LossyDctDecoder decoder;
  int csc;
  exr_coding_channel_info_t *chan;
  ChannelData *cd;
  int c_1;
  int y;
  int c;
  size_t dstLen;
  size_t uncompBytes;
  size_t destLen_1;
  size_t destLen;
  uint64_t ruleSize;
  uint8_t *compressedRleBuf;
  uint8_t *compressedDcBuf;
  uint8_t *compressedAcBuf;
  uint8_t *compressedUnknownBuf;
  uint8_t *dataPtrEnd;
  uint8_t *packedDcBufferEnd;
  uint8_t *packedAcBufferEnd;
  uint8_t *outBufferEnd;
  uint64_t dataLeft;
  uint8_t *dataPtr;
  uint64_t compressedSize;
  size_t outBufferSize;
  uint64_t acCompression;
  uint64_t totalDcUncompressedCount;
  uint64_t totalAcUncompressedCount;
  uint64_t rleRawSize;
  uint64_t rleUncompressedSize;
  uint64_t rleCompressedSize;
  uint64_t dcCompressedSize;
  uint64_t acCompressedSize;
  uint64_t unknownCompressedSize;
  uint64_t unknownUncompressedSize;
  uint64_t version;
  uint64_t counters [11];
  exr_result_t rv;
  uint64_t headerSize;
  uint8_t *in_stack_fffffffffffffce8;
  uint8_t *in_stack_fffffffffffffcf0;
  size_t in_stack_fffffffffffffcf8;
  int32_t in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  int32_t in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  DctCoderChannelData *in_stack_fffffffffffffd10;
  exr_decode_pipeline_t *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  LossyDctDecoder *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  int in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  int iVar15;
  uint64_t *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  int iVar16;
  uint8_t **in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  int in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  uint64_t in_stack_fffffffffffffd68;
  uint8_t *in_stack_fffffffffffffd70;
  exr_decode_pipeline_t *in_stack_fffffffffffffd78;
  uint64_t in_stack_fffffffffffffd90;
  size_t *in_stack_fffffffffffffda0;
  DwaCompressor *in_stack_fffffffffffffda8;
  int local_228;
  int local_1ac;
  ChannelData *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  int iVar17;
  ulong local_188;
  ulong local_178;
  long local_170;
  long local_168;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  long local_60;
  exr_decode_pipeline_t *local_58;
  int local_4c;
  size_t local_48;
  ulong local_30;
  void *local_28;
  DwaCompressor *local_20;
  exr_result_t local_14;
  
  local_48 = 0x58;
  local_4c = 0;
  if (in_RDX < 0x58) {
    local_14 = 0x17;
  }
  else {
    local_30 = in_RDX;
    local_28 = in_RSI;
    local_20 = in_RDI;
    memset(in_RCX,0,in_R8);
    memcpy(&local_a8,local_28,local_48);
    priv_to_native64(&local_a8,0xb);
    uVar8 = (long)local_28 + local_30;
    uVar9 = (long)local_28 + local_48;
    if ((((local_30 < local_48 + local_98 + local_90 + local_88 + local_80) || (local_30 < local_98)
         ) || (local_30 < local_90)) || ((local_30 < local_88 || (local_30 < local_80)))) {
      local_14 = 0x17;
    }
    else if (((((long)local_a0 < 0) || ((long)local_98 < 0)) ||
             (((long)local_90 < 0 ||
              ((((long)local_88 < 0 || ((long)local_80 < 0)) || ((long)local_78 < 0)))))) ||
            ((((long)local_70 < 0 || (local_68 < 0)) || (local_60 < 0)))) {
      local_14 = 0x17;
    }
    else {
      if (local_a8 < 2) {
        local_20->_channelRules = sLegacyChannelRules;
        local_20->_channelRuleCount = 0x19;
      }
      else {
        local_4c = DwaCompressor_readChannelRules
                             ((DwaCompressor *)
                              CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                              in_stack_fffffffffffffd50,
                              (uint64_t *)
                              CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                              in_stack_fffffffffffffd40);
        local_48 = local_168 + local_48;
      }
      if (local_4c == 0) {
        local_4c = DwaCompressor_initializeBuffers
                             (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
        local_14 = local_4c;
        if (local_4c == 0) {
          uVar10 = uVar9 + local_98;
          uVar11 = uVar10 + local_90;
          uVar12 = uVar11 + local_88;
          if (((uVar8 < uVar9) || (uVar10 < uVar9)) ||
             ((uVar8 < uVar10 ||
              ((((uVar11 < uVar9 || (uVar8 < uVar11)) || (uVar12 < uVar9)) ||
               ((uVar8 < uVar12 || (uVar8 < uVar12 + local_80)))))))) {
            local_14 = 0x17;
          }
          else if (local_a8 < 3) {
            local_4c = DwaCompressor_setupChannelData(local_20);
            if (local_98 != 0) {
              if (local_20->_planarUncBufferSize[0] < local_a0) {
                return 0x17;
              }
              eVar4 = exr_uncompress_buffer
                                ((exr_const_context_t)
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                 in_stack_fffffffffffffd40,
                                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                 (void *)CONCAT44(in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30),
                                 (size_t)in_stack_fffffffffffffd28,
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
              if (eVar4 != 0) {
                return 0x17;
              }
            }
            if (local_90 != 0) {
              if ((local_20->_packedAcBuffer == (uint8_t *)0x0) ||
                 (local_20->_packedAcBufferSize <= (ulong)(local_68 * 2) &&
                  local_68 * 2 - local_20->_packedAcBufferSize != 0)) {
                return 0x17;
              }
              if (local_58 == (exr_decode_pipeline_t *)0x0) {
                in_stack_fffffffffffffce8 = (uint8_t *)local_20->_decode->scratch_alloc_size_1;
                local_4c = internal_huf_decompress
                                     (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                                      in_stack_fffffffffffffd68,
                                      (uint16_t *)
                                      CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                      CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                                      in_stack_fffffffffffffd50,in_stack_fffffffffffffd90);
                in_stack_fffffffffffffd18 = local_58;
                if (local_4c != 0) {
                  return local_4c;
                }
              }
              else {
                if (local_58 != (exr_decode_pipeline_t *)0x1) {
                  return 0x17;
                }
                eVar4 = exr_uncompress_buffer
                                  ((exr_const_context_t)
                                   CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                   in_stack_fffffffffffffd40,
                                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                   (void *)CONCAT44(in_stack_fffffffffffffd34,
                                                    in_stack_fffffffffffffd30),
                                   (size_t)in_stack_fffffffffffffd28,
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
                if (eVar4 != 0) {
                  return eVar4;
                }
                local_4c = 0;
                in_stack_fffffffffffffd18 = local_58;
                if (local_68 * 2 - local_170 != 0) {
                  return 0x17;
                }
              }
            }
            if (local_88 == 0) {
              if (local_60 != 0) {
                return 0x17;
              }
            }
            else {
              if (local_20->_packedDcBufferSize < (ulong)(local_60 << 1)) {
                return 0x17;
              }
              local_4c = internal_decode_alloc_buffer
                                   (in_stack_fffffffffffffd18,
                                    (exr_transcoding_pipeline_buffer_id_t)
                                    ((ulong)in_stack_fffffffffffffd10 >> 0x20),
                                    (void **)CONCAT44(in_stack_fffffffffffffd0c,
                                                      in_stack_fffffffffffffd08),
                                    (size_t *)
                                    CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                    in_stack_fffffffffffffcf8);
              if (local_4c != 0) {
                return local_4c;
              }
              local_4c = exr_uncompress_buffer
                                   ((exr_const_context_t)
                                    CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                    in_stack_fffffffffffffd40,
                                    CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                    (void *)CONCAT44(in_stack_fffffffffffffd34,
                                                     in_stack_fffffffffffffd30),
                                    (size_t)in_stack_fffffffffffffd28,
                                    (size_t *)
                                    CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
              if ((local_4c != 0) || (local_60 << 1 != local_178)) {
                return 0x17;
              }
              internal_zip_reconstruct_bytes
                        (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x216328);
            }
            if (local_70 != 0) {
              if ((local_20->_rleBufferSize < local_78) ||
                 (local_20->_planarUncBufferSize[2] < local_70)) {
                return 0x17;
              }
              eVar4 = exr_uncompress_buffer
                                ((exr_const_context_t)
                                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                 in_stack_fffffffffffffd40,
                                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                                 (void *)CONCAT44(in_stack_fffffffffffffd34,
                                                  in_stack_fffffffffffffd30),
                                 (size_t)in_stack_fffffffffffffd28,
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
              if (eVar4 != 0) {
                return 0x17;
              }
              if (local_188 != local_78) {
                return 0x17;
              }
              uVar13 = internal_rle_decompress
                                 ((uint8_t *)in_stack_fffffffffffffd28,
                                  CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                  (uint8_t *)in_stack_fffffffffffffd18,
                                  (uint64_t)in_stack_fffffffffffffd10);
              if (uVar13 != local_70) {
                return 0x17;
              }
            }
            for (iVar17 = 0; iVar17 < local_20->_numChannels; iVar17 = iVar17 + 1) {
              local_20->_channelData[iVar17].processed = 0;
            }
            for (iVar5 = local_20->_min[1]; iVar5 <= local_20->_max[1]; iVar5 = iVar5 + 1) {
              for (in_stack_fffffffffffffe6c = 0; in_stack_fffffffffffffe6c < local_20->_numChannels
                  ; in_stack_fffffffffffffe6c = in_stack_fffffffffffffe6c + 1) {
                in_stack_fffffffffffffe60 = local_20->_channelData + in_stack_fffffffffffffe6c;
                peVar1 = in_stack_fffffffffffffe60->chan;
                if (iVar5 % peVar1->y_samples == 0) {
                  eVar4 = DctCoderChannelData_push_row
                                    ((_func_void_ptr_size_t *)in_stack_fffffffffffffd18,
                                     (_func_void_void_ptr *)in_stack_fffffffffffffd10,
                                     (DctCoderChannelData *)
                                     CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                                     (uint8_t *)
                                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
                  if (eVar4 != 0) {
                    return eVar4;
                  }
                  (in_stack_fffffffffffffe60->_dctData)._type = (uint)peVar1->data_type;
                  local_4c = 0;
                }
              }
            }
            for (local_1ac = 0; local_1ac < local_20->_numCscChannelSets; local_1ac = local_1ac + 1)
            {
              pCVar14 = local_20->_cscChannelSets + local_1ac;
              iVar6 = pCVar14->idx[0];
              iVar7 = pCVar14->idx[1];
              iVar16 = pCVar14->idx[2];
              if (((local_20->_channelData[iVar6].compression != LOSSY_DCT) ||
                  (local_20->_channelData[iVar7].compression != LOSSY_DCT)) ||
                 (local_20->_channelData[iVar16].compression != LOSSY_DCT)) {
                return 0x17;
              }
              in_stack_fffffffffffffd00 = (local_20->_channelData[iVar6].chan)->width;
              in_stack_fffffffffffffd08 = (local_20->_channelData[iVar6].chan)->height;
              in_stack_fffffffffffffcf8 = 0;
              local_4c = LossyDctDecoderCsc_construct
                                   (in_stack_fffffffffffffd28,
                                    (DctCoderChannelData *)
                                    CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                    (DctCoderChannelData *)in_stack_fffffffffffffd18,
                                    in_stack_fffffffffffffd10,
                                    (uint8_t *)
                                    CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                                    (uint8_t *)
                                    CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                    (uint8_t *)in_stack_fffffffffffffd40,
                                    CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                    (uint16_t *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd58,
                                    in_stack_fffffffffffffd60);
              if (local_4c == 0) {
                local_4c = LossyDctDecoder_execute
                                     ((_func_void_ptr_size_t *)CONCAT44(iVar17,iVar5),
                                      (_func_void_void_ptr *)
                                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                      (LossyDctDecoder *)in_stack_fffffffffffffe60);
              }
              local_20->_channelData[iVar6].processed = 1;
              local_20->_channelData[iVar7].processed = 1;
              local_20->_channelData[iVar16].processed = 1;
              if (local_4c != 0) {
                return local_4c;
              }
            }
            for (local_228 = 0; local_228 < local_20->_numChannels; local_228 = local_228 + 1) {
              pCVar2 = local_20->_channelData;
              peVar1 = pCVar2[local_228].chan;
              iVar6 = (int)peVar1->bytes_per_element;
              if (pCVar2[local_228].processed == 0) {
                src0 = (uint8_t *)(ulong)pCVar2[local_228].compression;
                switch(src0) {
                case (uint8_t *)0x0:
                  in_stack_fffffffffffffd34 = 0;
                  __n = (long)peVar1->width * (long)iVar6;
                  for (in_stack_fffffffffffffd24 = local_20->_min[1];
                      in_stack_fffffffffffffd24 <= local_20->_max[1];
                      in_stack_fffffffffffffd24 = in_stack_fffffffffffffd24 + 1) {
                    if (in_stack_fffffffffffffd24 % peVar1->y_samples == 0) {
                      if (local_20->_planarUncBuffer[0] + local_20->_planarUncBufferSize[0] <
                          pCVar2[local_228].planarUncBufferEnd + __n) {
                        return 0x17;
                      }
                      memcpy(pCVar2[local_228]._dctData._rows[in_stack_fffffffffffffd34],
                             pCVar2[local_228].planarUncBufferEnd,__n);
                      pCVar2[local_228].planarUncBufferEnd =
                           pCVar2[local_228].planarUncBufferEnd + __n;
                      in_stack_fffffffffffffd34 = in_stack_fffffffffffffd34 + 1;
                    }
                  }
                  break;
                case (uint8_t *)0x1:
                  in_stack_fffffffffffffcf8 =
                       CONCAT44((int)(in_stack_fffffffffffffcf8 >> 0x20),peVar1->height);
                  local_4c = LossyDctDecoder_construct
                                       ((LossyDctDecoder *)
                                        CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20
                                                ),(DctCoderChannelData *)in_stack_fffffffffffffd18,
                                        src0,(uint8_t *)
                                             CONCAT44(in_stack_fffffffffffffd0c,
                                                      in_stack_fffffffffffffd08),
                                        (uint8_t *)
                                        CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00
                                                ),in_stack_fffffffffffffcf8,
                                        (uint16_t *)
                                        CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30
                                                ),in_stack_fffffffffffffd38,
                                        (int)in_stack_fffffffffffffd40);
                  if (local_4c == 0) {
                    local_4c = LossyDctDecoder_execute
                                         ((_func_void_ptr_size_t *)CONCAT44(iVar17,iVar5),
                                          (_func_void_void_ptr *)
                                          CONCAT44(in_stack_fffffffffffffe6c,
                                                   in_stack_fffffffffffffe68),
                                          (LossyDctDecoder *)in_stack_fffffffffffffe60);
                  }
                  if (local_4c != 0) {
                    return local_4c;
                  }
                  break;
                case (uint8_t *)0x2:
                  iVar16 = 0;
                  for (iVar7 = local_20->_min[1]; iVar7 <= local_20->_max[1]; iVar7 = iVar7 + 1) {
                    if (iVar7 % peVar1->y_samples == 0) {
                      in_stack_fffffffffffffd40 =
                           (uint64_t *)pCVar2[local_228]._dctData._rows[iVar16];
                      if (iVar6 == 2) {
                        interleaveByte2((uint8_t *)in_stack_fffffffffffffd18,src0,
                                        (uint8_t *)
                                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08
                                                ),in_stack_fffffffffffffd04);
                        pCVar2[local_228].planarUncRleEnd[0] =
                             pCVar2[local_228].planarUncRleEnd[0] + peVar1->width;
                        pCVar2[local_228].planarUncRleEnd[1] =
                             pCVar2[local_228].planarUncRleEnd[1] + peVar1->width;
                      }
                      else {
                        for (iVar15 = 0; iVar15 < peVar1->width; iVar15 = iVar15 + 1) {
                          for (in_stack_fffffffffffffd38 = 0; in_stack_fffffffffffffd38 < iVar6;
                              in_stack_fffffffffffffd38 = in_stack_fffffffffffffd38 + 1) {
                            puVar3 = pCVar2[local_228].planarUncRleEnd[in_stack_fffffffffffffd38];
                            pCVar2[local_228].planarUncRleEnd[in_stack_fffffffffffffd38] =
                                 puVar3 + 1;
                            *(uint8_t *)in_stack_fffffffffffffd40 = *puVar3;
                            in_stack_fffffffffffffd40 =
                                 (uint64_t *)((long)in_stack_fffffffffffffd40 + 1);
                          }
                        }
                      }
                      iVar16 = iVar16 + 1;
                    }
                  }
                  break;
                case (uint8_t *)0x3:
                default:
                  return 0x17;
                }
                pCVar2[local_228].processed = 1;
              }
            }
            local_14 = local_4c;
          }
          else {
            local_14 = 0x16;
          }
        }
      }
      else {
        local_14 = local_4c;
      }
    }
  }
  return local_14;
}

Assistant:

exr_result_t
DwaCompressor_uncompress (
    DwaCompressor* me,
    const uint8_t* inPtr,
    uint64_t       iSize,
    void*          uncompressed_data,
    uint64_t       uncompressed_size)
{
    uint64_t     headerSize = NUM_SIZES_SINGLE * sizeof (uint64_t);
    exr_result_t rv         = EXR_ERR_SUCCESS;
    uint64_t     counters[NUM_SIZES_SINGLE];
    uint64_t     version;
    uint64_t     unknownUncompressedSize;
    uint64_t     unknownCompressedSize;
    uint64_t     acCompressedSize;
    uint64_t     dcCompressedSize;
    uint64_t     rleCompressedSize;
    uint64_t     rleUncompressedSize;
    uint64_t     rleRawSize;

    uint64_t totalAcUncompressedCount;
    uint64_t totalDcUncompressedCount;

    uint64_t acCompression;

    size_t         outBufferSize;
    uint64_t       compressedSize;
    const uint8_t* dataPtr;
    uint64_t       dataLeft;
    uint8_t*       outBufferEnd;
    uint8_t*       packedAcBufferEnd;
    uint8_t*       packedDcBufferEnd;
    const uint8_t* dataPtrEnd;
    const uint8_t* compressedUnknownBuf;
    const uint8_t* compressedAcBuf;
    const uint8_t* compressedDcBuf;
    const uint8_t* compressedRleBuf;

    if (iSize < headerSize) return EXR_ERR_CORRUPT_CHUNK;

    //
    // Flip the counters from XDR to NATIVE
    //

    memset (uncompressed_data, 0, uncompressed_size);

    memcpy (counters, inPtr, headerSize);
    priv_to_native64 (counters, NUM_SIZES_SINGLE);

    //
    // Unwind all the counter info
    //
    version                 = counters[VERSION];
    unknownUncompressedSize = counters[UNKNOWN_UNCOMPRESSED_SIZE];
    unknownCompressedSize   = counters[UNKNOWN_COMPRESSED_SIZE];
    acCompressedSize        = counters[AC_COMPRESSED_SIZE];
    dcCompressedSize        = counters[DC_COMPRESSED_SIZE];
    rleCompressedSize       = counters[RLE_COMPRESSED_SIZE];
    rleUncompressedSize     = counters[RLE_UNCOMPRESSED_SIZE];
    rleRawSize              = counters[RLE_RAW_SIZE];

    totalAcUncompressedCount = counters[AC_UNCOMPRESSED_COUNT];
    totalDcUncompressedCount = counters[DC_UNCOMPRESSED_COUNT];

    acCompression = counters[AC_COMPRESSION];

    compressedSize = unknownCompressedSize + acCompressedSize +
                     dcCompressedSize + rleCompressedSize;

    dataPtrEnd = inPtr + iSize;
    dataPtr    = inPtr + headerSize;
    dataLeft   = iSize - headerSize;

    /* Both the sum and individual sizes are checked in case of overflow. */
    if (iSize < (headerSize + compressedSize) ||
        iSize < unknownCompressedSize || iSize < acCompressedSize ||
        iSize < dcCompressedSize || iSize < rleCompressedSize)
    {
        return EXR_ERR_CORRUPT_CHUNK;
    }

    if ((int64_t) unknownUncompressedSize < 0 ||
        (int64_t) unknownCompressedSize < 0 || (int64_t) acCompressedSize < 0 ||
        (int64_t) dcCompressedSize < 0 || (int64_t) rleCompressedSize < 0 ||
        (int64_t) rleUncompressedSize < 0 || (int64_t) rleRawSize < 0 ||
        (int64_t) totalAcUncompressedCount < 0 ||
        (int64_t) totalDcUncompressedCount < 0)
    {
        return EXR_ERR_CORRUPT_CHUNK;
    }

    if (version < 2)
    {
        me->_channelRules = sLegacyChannelRules;
        me->_channelRuleCount =
            sizeof (sLegacyChannelRules) / sizeof (Classifier);
    }
    else
    {
        uint64_t ruleSize;
        rv =
            DwaCompressor_readChannelRules (me, &dataPtr, &dataLeft, &ruleSize);

        headerSize += ruleSize;
    }

    if (rv != EXR_ERR_SUCCESS) return rv;

    outBufferSize = 0;
    rv            = DwaCompressor_initializeBuffers (me, &outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Allocate _outBuffer, if we haven't done so already
    //

    // the C++ classes used to have one buffer size for compress / uncompress
    // but here we want to do zero-ish copy...
    outBufferEnd  = me->_decode->unpacked_buffer;
    outBufferSize = me->_decode->unpacked_alloc_size;

    //
    // Find the start of the RLE packed AC components and
    // the DC components for each channel. This will be handy
    // if you want to decode the channels in parallel later on.
    //

    packedAcBufferEnd = NULL;

    if (me->_packedAcBuffer) packedAcBufferEnd = me->_packedAcBuffer;

    packedDcBufferEnd = NULL;

    if (me->_packedDcBuffer) packedDcBufferEnd = me->_packedDcBuffer;

    //
    // UNKNOWN data is packed first, followed by the
    // Huffman-compressed AC, then the DC values,
    // and then the zlib compressed RLE data.
    //

    compressedUnknownBuf = dataPtr;

    compressedAcBuf =
        compressedUnknownBuf + (ptrdiff_t) (unknownCompressedSize);
    compressedDcBuf  = compressedAcBuf + (ptrdiff_t) (acCompressedSize);
    compressedRleBuf = compressedDcBuf + (ptrdiff_t) (dcCompressedSize);

    if (compressedUnknownBuf > dataPtrEnd || dataPtr > compressedAcBuf ||
        compressedAcBuf > dataPtrEnd || dataPtr > compressedDcBuf ||
        compressedDcBuf > dataPtrEnd || dataPtr > compressedRleBuf ||
        compressedRleBuf > dataPtrEnd ||
        (compressedRleBuf + rleCompressedSize) > dataPtrEnd)
    {
        return EXR_ERR_CORRUPT_CHUNK;
    }

    //
    // Sanity check that the version is something we expect. Right now,
    // we can decode version 0, 1, and 2. v1 adds 'end of block' symbols
    // to the AC RLE. v2 adds channel classification rules at the
    // start of the data block.
    //

    if (version > 2) { return EXR_ERR_BAD_CHUNK_LEADER; }

    rv = DwaCompressor_setupChannelData (me);

    //
    // Uncompress the UNKNOWN data into _planarUncBuffer[UNKNOWN]
    //

    if (unknownCompressedSize > 0)
    {
        if (unknownUncompressedSize > me->_planarUncBufferSize[UNKNOWN])
        {
            return EXR_ERR_CORRUPT_CHUNK;
        }

        if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                                   me->_decode->context,
                                   compressedUnknownBuf,
                                   unknownCompressedSize,
                                   me->_planarUncBuffer[UNKNOWN],
                                   unknownUncompressedSize,
                                   NULL))
        {
            return EXR_ERR_CORRUPT_CHUNK;
        }
    }

    //
    // Uncompress the AC data into _packedAcBuffer
    //

    if (acCompressedSize > 0)
    {
        if (!me->_packedAcBuffer ||
            totalAcUncompressedCount * sizeof (uint16_t) >
                me->_packedAcBufferSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
        }

        //
        // Don't trust the user to get it right, look in the file.
        //

        switch (acCompression)
        {
            case STATIC_HUFFMAN:
                rv = internal_huf_decompress (
                    me->_decode,
                    compressedAcBuf,
                    acCompressedSize,
                    (uint16_t*) me->_packedAcBuffer,
                    totalAcUncompressedCount,
                    me->_decode->scratch_buffer_1,
                    me->_decode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS) { return rv; }
                break;

            case DEFLATE: {
                size_t destLen;

                rv = exr_uncompress_buffer (
                    me->_decode->context,
                    compressedAcBuf,
                    acCompressedSize,
                    me->_packedAcBuffer,
                    totalAcUncompressedCount * sizeof (uint16_t),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS) return rv;

                if (totalAcUncompressedCount * sizeof (uint16_t) != destLen)
                {
                    return EXR_ERR_CORRUPT_CHUNK;
                }
            }
            break;

            default: return EXR_ERR_CORRUPT_CHUNK; break;
        }
    }

    //
    // Uncompress the DC data into _packedDcBuffer
    //

    if (dcCompressedSize > 0)
    {
        size_t destLen;
        size_t uncompBytes = totalDcUncompressedCount * sizeof (uint16_t);
        if (uncompBytes > me->_packedDcBufferSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
        }

        rv = internal_decode_alloc_buffer (
            me->_decode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_decode->scratch_buffer_1),
            &(me->_decode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        rv = exr_uncompress_buffer (
            me->_decode->context,
            compressedDcBuf,
            dcCompressedSize,
            me->_decode->scratch_buffer_1,
            uncompBytes,
            &destLen);
        if (rv != EXR_ERR_SUCCESS || (uncompBytes != destLen))
        {
            return EXR_ERR_CORRUPT_CHUNK;
        }

        internal_zip_reconstruct_bytes (
            me->_packedDcBuffer, me->_decode->scratch_buffer_1, uncompBytes);
    }
    else
    {
        // if the compressed size is 0, then the uncompressed size must also be zero
        if (totalDcUncompressedCount != 0) { return EXR_ERR_CORRUPT_CHUNK; }
    }

    //
    // Uncompress the RLE data into _rleBuffer, then unRLE the results
    // into _planarUncBuffer[RLE]
    //

    if (rleRawSize > 0)
    {
        size_t dstLen;

        if (rleUncompressedSize > me->_rleBufferSize ||
            rleRawSize > me->_planarUncBufferSize[RLE])
        {
            return EXR_ERR_CORRUPT_CHUNK;
        }

        if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                                   me->_decode->context,
                                   compressedRleBuf,
                                   rleCompressedSize,
                                   me->_rleBuffer,
                                   rleUncompressedSize,
                                   &dstLen))
        {
            return EXR_ERR_CORRUPT_CHUNK;
        }

        if (dstLen != rleUncompressedSize) { return EXR_ERR_CORRUPT_CHUNK; }

        if (internal_rle_decompress (
                me->_planarUncBuffer[RLE],
                rleRawSize,
                (const uint8_t*) me->_rleBuffer,
                rleUncompressedSize) != rleRawSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
        }
    }

    //
    // Determine the start of each row in the output buffer
    //
    for (int c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (int c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (
                me->alloc_fn, me->free_fn, &(cd->_dctData), outBufferEnd);
            if (rv != EXR_ERR_SUCCESS) return rv;

            cd->_dctData._type = chan->data_type;
            outBufferEnd += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Setup to decode each block of 3 channels that need to
    // be handled together
    //

    for (int csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctDecoder decoder;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        int rChan = cset->idx[0];
        int gChan = cset->idx[1];
        int bChan = cset->idx[2];

        if (me->_channelData[rChan].compression != LOSSY_DCT ||
            me->_channelData[gChan].compression != LOSSY_DCT ||
            me->_channelData[bChan].compression != LOSSY_DCT)
        {
            return EXR_ERR_CORRUPT_CHUNK;
        }

        rv = LossyDctDecoderCsc_construct (
            &decoder,
            &(me->_channelData[rChan]._dctData),
            &(me->_channelData[gChan]._dctData),
            &(me->_channelData[bChan]._dctData),
            packedAcBufferEnd,
            packedAcBufferEnd + totalAcUncompressedCount * sizeof (uint16_t),
            packedDcBufferEnd,
            totalDcUncompressedCount,
            dwaCompressorToLinear,
            me->_channelData[rChan].chan->width,
            me->_channelData[rChan].chan->height);

        if (rv == EXR_ERR_SUCCESS)
            rv = LossyDctDecoder_execute (me->alloc_fn, me->free_fn, &decoder);

        packedAcBufferEnd += decoder._packedAcCount * sizeof (uint16_t);

        packedDcBufferEnd += decoder._packedDcCount * sizeof (uint16_t);
        totalDcUncompressedCount -= decoder._packedDcCount;

        me->_channelData[rChan].processed = 1;
        me->_channelData[gChan].processed = 1;
        me->_channelData[bChan].processed = 1;

        if (rv != EXR_ERR_SUCCESS) { return rv; }
    }

    //
    // Setup to handle the remaining channels by themselves
    //

    for (int c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*               cd        = &(me->_channelData[c]);
        exr_coding_channel_info_t* chan      = cd->chan;
        DctCoderChannelData*       dcddata   = &(cd->_dctData);
        int                        pixelSize = chan->bytes_per_element;

        if (cd->processed) continue;

        switch (cd->compression)
        {
            case LOSSY_DCT:

                //
                // Setup a single-channel lossy DCT decoder pointing
                // at the output buffer
                //

                {
                    const uint16_t* linearLut = NULL;
                    LossyDctDecoder decoder;

                    if (!chan->p_linear) linearLut = dwaCompressorToLinear;

                    rv = LossyDctDecoder_construct (
                        &decoder,
                        dcddata,
                        packedAcBufferEnd,
                        packedAcBufferEnd +
                            totalAcUncompressedCount * sizeof (uint16_t),
                        packedDcBufferEnd,
                        totalDcUncompressedCount,
                        linearLut,
                        chan->width,
                        chan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctDecoder_execute (
                            me->alloc_fn, me->free_fn, &decoder);

                    packedAcBufferEnd +=
                        (size_t) decoder._packedAcCount * sizeof (uint16_t);

                    packedDcBufferEnd +=
                        (size_t) decoder._packedDcCount * sizeof (uint16_t);

                    totalDcUncompressedCount -= decoder._packedDcCount;
                    if (rv != EXR_ERR_SUCCESS) { return rv; }
                }

                break;

            case RLE:

                //
                // For the RLE case, the data has been un-RLE'd into
                // planarUncRleEnd[], but is still split out by bytes.
                // We need to rearrange the bytes back into the correct
                // order in the output buffer;
                //

                {
                    int row = 0;

                    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
                    {
                        uint8_t* dst;
                        if ((y % chan->y_samples) != 0) continue;

                        dst = dcddata->_rows[row];

                        if (pixelSize == 2)
                        {
                            interleaveByte2 (
                                dst,
                                cd->planarUncRleEnd[0],
                                cd->planarUncRleEnd[1],
                                chan->width);

                            cd->planarUncRleEnd[0] += chan->width;
                            cd->planarUncRleEnd[1] += chan->width;
                        }
                        else
                        {
                            for (int x = 0; x < chan->width; ++x)
                            {
                                for (int byte = 0; byte < pixelSize; ++byte)
                                {
                                    *dst++ = *cd->planarUncRleEnd[byte]++;
                                }
                            }
                        }

                        row++;
                    }
                }

                break;

            case UNKNOWN:

                //
                // In the UNKNOWN case, data is already in planarUncBufferEnd
                // and just needs to copied over to the output buffer
                //

                {
                    int    row = 0;
                    size_t dstScanlineSize =
                        (size_t) chan->width * (size_t) pixelSize;

                    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
                    {
                        if ((y % chan->y_samples) != 0) continue;

                        //
                        // sanity check for buffer data lying within range
                        //
                        if ((cd->planarUncBufferEnd +
                             (size_t) (dstScanlineSize)) >
                            (me->_planarUncBuffer[UNKNOWN] +
                             me->_planarUncBufferSize[UNKNOWN]))
                        {
                            return EXR_ERR_CORRUPT_CHUNK;
                        }

                        memcpy (
                            dcddata->_rows[row],
                            cd->planarUncBufferEnd,
                            dstScanlineSize);

                        cd->planarUncBufferEnd += dstScanlineSize;
                        row++;
                    }
                }

                break;

            case NUM_COMPRESSOR_SCHEMES:
            default: return EXR_ERR_CORRUPT_CHUNK; break;
        }

        cd->processed = 1;
    }

    return rv;
}